

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O3

int ecp_add_mixed(mbedtls_ecp_group *grp,mbedtls_ecp_point *R,mbedtls_ecp_point *P,
                 mbedtls_ecp_point *Q)

{
  mbedtls_mpi *X_00;
  int iVar1;
  size_t count;
  mbedtls_ecp_point *Q_00;
  mbedtls_mpi T1;
  mbedtls_mpi T3;
  mbedtls_mpi T2;
  mbedtls_mpi X;
  mbedtls_mpi T4;
  mbedtls_mpi Z;
  mbedtls_mpi Y;
  mbedtls_mpi mStack_d8;
  mbedtls_mpi local_c0;
  mbedtls_mpi local_a8;
  mbedtls_mpi local_90;
  mbedtls_mpi local_78;
  mbedtls_mpi local_60;
  mbedtls_mpi local_48;
  
  add_count = add_count + 1;
  X_00 = &P->Z;
  iVar1 = mbedtls_mpi_cmp_int(X_00,0);
  Q_00 = Q;
  if (iVar1 != 0) {
    if ((Q->Z).p != (mbedtls_mpi_uint *)0x0) {
      iVar1 = mbedtls_mpi_cmp_int(&Q->Z,0);
      Q_00 = P;
      if (iVar1 == 0) goto LAB_0011064d;
      if (((Q->Z).p != (mbedtls_mpi_uint *)0x0) &&
         (iVar1 = mbedtls_mpi_cmp_int(&Q->Z,1), iVar1 != 0)) {
        return -0x4f80;
      }
    }
    mbedtls_mpi_init(&mStack_d8);
    mbedtls_mpi_init(&local_a8);
    mbedtls_mpi_init(&local_c0);
    mbedtls_mpi_init(&local_78);
    mbedtls_mpi_init(&local_90);
    mbedtls_mpi_init(&local_48);
    mbedtls_mpi_init(&local_60);
    iVar1 = mbedtls_mpi_mul_mpi(&mStack_d8,X_00,X_00);
    if ((iVar1 == 0) && (iVar1 = ecp_modp(&mStack_d8,grp), iVar1 == 0)) {
      mul_count = mul_count + 1;
      iVar1 = mbedtls_mpi_mul_mpi(&local_a8,&mStack_d8,X_00);
      if ((iVar1 == 0) && (iVar1 = ecp_modp(&local_a8,grp), iVar1 == 0)) {
        mul_count = mul_count + 1;
        iVar1 = mbedtls_mpi_mul_mpi(&mStack_d8,&mStack_d8,&Q->X);
        if ((iVar1 == 0) && (iVar1 = ecp_modp(&mStack_d8,grp), iVar1 == 0)) {
          mul_count = mul_count + 1;
          iVar1 = mbedtls_mpi_mul_mod(grp,&local_a8,&local_a8,&Q->Y);
          if ((iVar1 == 0) &&
             (iVar1 = mbedtls_mpi_sub_mod(grp,&mStack_d8,&mStack_d8,&P->X), iVar1 == 0)) {
            iVar1 = mbedtls_mpi_sub_mod(grp,&local_a8,&local_a8,&P->Y);
            if (iVar1 == 0) {
              iVar1 = mbedtls_mpi_cmp_int(&mStack_d8,0);
              if (iVar1 == 0) {
                iVar1 = mbedtls_mpi_cmp_int(&local_a8,0);
                if (iVar1 == 0) {
                  iVar1 = ecp_double_jac(grp,R,P);
                }
                else {
                  iVar1 = mbedtls_ecp_set_zero(R);
                }
              }
              else {
                iVar1 = mbedtls_mpi_mul_mod(grp,&local_60,X_00,&mStack_d8);
                if (((((iVar1 == 0) &&
                      (iVar1 = mbedtls_mpi_mul_mod(grp,&local_c0,&mStack_d8,&mStack_d8), iVar1 == 0)
                      ) && (iVar1 = mbedtls_mpi_mul_mod(grp,&local_78,&local_c0,&mStack_d8),
                           iVar1 == 0)) &&
                    (((iVar1 = mbedtls_mpi_mul_mod(grp,&local_c0,&local_c0,&P->X), iVar1 == 0 &&
                      (iVar1 = mbedtls_mpi_copy(&mStack_d8,&local_c0), iVar1 == 0)) &&
                     ((iVar1 = mbedtls_mpi_shift_l_mod(grp,&mStack_d8,count), iVar1 == 0 &&
                      ((iVar1 = mbedtls_mpi_mul_mod(grp,&local_90,&local_a8,&local_a8), iVar1 == 0
                       && (iVar1 = mbedtls_mpi_sub_mod(grp,&local_90,&local_90,&mStack_d8),
                          iVar1 == 0)))))))) &&
                   ((iVar1 = mbedtls_mpi_sub_mod(grp,&local_90,&local_90,&local_78), iVar1 == 0 &&
                    (((((iVar1 = mbedtls_mpi_sub_mod(grp,&local_c0,&local_c0,&local_90), iVar1 == 0
                        && (iVar1 = mbedtls_mpi_mul_mod(grp,&local_c0,&local_c0,&local_a8),
                           iVar1 == 0)) &&
                       (iVar1 = mbedtls_mpi_mul_mod(grp,&local_78,&local_78,&P->Y), iVar1 == 0)) &&
                      ((iVar1 = mbedtls_mpi_sub_mod(grp,&local_48,&local_c0,&local_78), iVar1 == 0
                       && (iVar1 = mbedtls_mpi_copy(&R->X,&local_90), iVar1 == 0)))) &&
                     (iVar1 = mbedtls_mpi_copy(&R->Y,&local_48), iVar1 == 0)))))) {
                  iVar1 = mbedtls_mpi_copy(&R->Z,&local_60);
                }
              }
            }
          }
        }
      }
    }
    mbedtls_mpi_free(&mStack_d8);
    mbedtls_mpi_free(&local_a8);
    mbedtls_mpi_free(&local_c0);
    mbedtls_mpi_free(&local_78);
    mbedtls_mpi_free(&local_90);
    mbedtls_mpi_free(&local_48);
    mbedtls_mpi_free(&local_60);
    return iVar1;
  }
LAB_0011064d:
  iVar1 = mbedtls_ecp_copy(R,Q_00);
  return iVar1;
}

Assistant:

static int ecp_add_mixed( const mbedtls_ecp_group *grp, mbedtls_ecp_point *R,
                          const mbedtls_ecp_point *P, const mbedtls_ecp_point *Q )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    mbedtls_mpi T1, T2, T3, T4, X, Y, Z;

#if defined(MBEDTLS_SELF_TEST)
    add_count++;
#endif

#if defined(MBEDTLS_ECP_ADD_MIXED_ALT)
    if( mbedtls_internal_ecp_grp_capable( grp ) )
        return( mbedtls_internal_ecp_add_mixed( grp, R, P, Q ) );
#endif /* MBEDTLS_ECP_ADD_MIXED_ALT */

    /*
     * Trivial cases: P == 0 or Q == 0 (case 1)
     */
    if( mbedtls_mpi_cmp_int( &P->Z, 0 ) == 0 )
        return( mbedtls_ecp_copy( R, Q ) );

    if( Q->Z.p != NULL && mbedtls_mpi_cmp_int( &Q->Z, 0 ) == 0 )
        return( mbedtls_ecp_copy( R, P ) );

    /*
     * Make sure Q coordinates are normalized
     */
    if( Q->Z.p != NULL && mbedtls_mpi_cmp_int( &Q->Z, 1 ) != 0 )
        return( MBEDTLS_ERR_ECP_BAD_INPUT_DATA );

    mbedtls_mpi_init( &T1 ); mbedtls_mpi_init( &T2 ); mbedtls_mpi_init( &T3 ); mbedtls_mpi_init( &T4 );
    mbedtls_mpi_init( &X ); mbedtls_mpi_init( &Y ); mbedtls_mpi_init( &Z );

    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mod( grp, &T1,  &P->Z,  &P->Z ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mod( grp, &T2,  &T1,    &P->Z ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mod( grp, &T1,  &T1,    &Q->X ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mod( grp, &T2,  &T2,    &Q->Y ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_sub_mod( grp, &T1,  &T1,    &P->X ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_sub_mod( grp, &T2,  &T2,    &P->Y ) );

    /* Special cases (2) and (3) */
    if( mbedtls_mpi_cmp_int( &T1, 0 ) == 0 )
    {
        if( mbedtls_mpi_cmp_int( &T2, 0 ) == 0 )
        {
            ret = ecp_double_jac( grp, R, P );
            goto cleanup;
        }
        else
        {
            ret = mbedtls_ecp_set_zero( R );
            goto cleanup;
        }
    }

    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mod( grp, &Z,   &P->Z,  &T1   ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mod( grp, &T3,  &T1,    &T1   ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mod( grp, &T4,  &T3,    &T1   ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mod( grp, &T3,  &T3,    &P->X ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_copy( &T1, &T3 ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_shift_l_mod( grp, &T1,  1     ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mod( grp, &X,   &T2,    &T2   ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_sub_mod( grp, &X,   &X,     &T1   ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_sub_mod( grp, &X,   &X,     &T4   ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_sub_mod( grp, &T3,  &T3,    &X    ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mod( grp, &T3,  &T3,    &T2   ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mod( grp, &T4,  &T4,    &P->Y ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_sub_mod( grp, &Y,   &T3,    &T4   ) );

    MBEDTLS_MPI_CHK( mbedtls_mpi_copy( &R->X, &X ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_copy( &R->Y, &Y ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_copy( &R->Z, &Z ) );

cleanup:

    mbedtls_mpi_free( &T1 ); mbedtls_mpi_free( &T2 ); mbedtls_mpi_free( &T3 ); mbedtls_mpi_free( &T4 );
    mbedtls_mpi_free( &X ); mbedtls_mpi_free( &Y ); mbedtls_mpi_free( &Z );

    return( ret );
}